

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua.c
# Opt level: O2

int report(lua_State *L,int status)

{
  char *pcVar1;
  char *msg;
  
  if (status != 0) {
    pcVar1 = (char *)lua_tolstring(L,0xffffffffffffffff,0);
    msg = "(error message not a string)";
    if (pcVar1 != (char *)0x0) {
      msg = pcVar1;
    }
    l_message(progname,msg);
    lua_settop(L,0xfffffffffffffffe);
  }
  return status;
}

Assistant:

static int report (lua_State *L, int status) {
  if (status != LUA_OK) {
    const char *msg = lua_tostring(L, -1);
    if (msg == NULL)
      msg = "(error message not a string)";
    l_message(progname, msg);
    lua_pop(L, 1);  /* remove message */
  }
  return status;
}